

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseImport(Parser *this,ImportRule *importRule)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  skipSpace(this);
  bVar4 = test(this,STRING);
  if (bVar4) {
    lexem((QString *)&local_48,this);
    pDVar2 = (importRule->href).d.d;
    pcVar3 = (importRule->href).d.ptr;
    (importRule->href).d.d = local_48.d;
    (importRule->href).d.ptr = local_48.ptr;
    qVar1 = (importRule->href).d.size;
    (importRule->href).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_00545d13:
    removeOptionalQuotes(&importRule->href);
    skipSpace(this);
    bVar4 = testMedium(this);
    if (bVar4) {
      parseMedium(this,&importRule->media);
      do {
        bVar4 = test(this,COMMA);
        if (!bVar4) goto LAB_00545d68;
        skipSpace(this);
        bVar4 = parseNextMedium(this,&importRule->media);
      } while (bVar4);
    }
    else {
LAB_00545d68:
      bVar4 = next(this,SEMICOLON);
      if (bVar4) {
        skipSpace(this);
        bVar4 = true;
        goto LAB_00545d85;
      }
    }
  }
  else {
    bVar4 = testAndParseUri(this,&importRule->href);
    if (bVar4) goto LAB_00545d13;
  }
  bVar4 = false;
LAB_00545d85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Parser::parseImport(ImportRule *importRule)
{
    skipSpace();

    if (test(STRING)) {
        importRule->href = lexem();
    } else {
        if (!testAndParseUri(&importRule->href)) return false;
    }
    removeOptionalQuotes(&importRule->href);

    skipSpace();

    if (testMedium()) {
        if (!parseMedium(&importRule->media)) return false;

        while (test(COMMA)) {
            skipSpace();
            if (!parseNextMedium(&importRule->media)) return false;
        }
    }

    if (!next(SEMICOLON)) return false;

    skipSpace();
    return true;
}